

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Object::readFrom(Object *this,BinaryReader *binary)

{
  pointer puVar1;
  runtime_error *this_00;
  size_t in_RCX;
  ulong uVar2;
  void *in_RDX;
  ulong uVar3;
  int iVar4;
  int ID;
  ulong uVar5;
  shared_ptr<pbrt::Instance> local_48;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffc8;
  BinaryReader::read(binary,(int)&local_48,in_RDX,in_RCX);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_48);
  if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&stack0xffffffffffffffc8) {
    operator_delete(local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(uStack_37,local_38) + 1);
  }
  uVar3 = binary->currentEntityOffset + 4;
  puVar1 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(binary->currentEntityData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar2 < uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    iVar4 = *(int *)(puVar1 + binary->currentEntityOffset);
    binary->currentEntityOffset = uVar3;
    ID = (int)binary;
    if (0 < iVar4) {
      do {
        uVar3 = binary->currentEntityOffset + 4;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(binary->currentEntityData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < uVar3) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
          goto LAB_00119560;
        }
        binary->currentEntityOffset = uVar3;
        BinaryReader::getEntity<pbrt::Shape>((BinaryReader *)&local_48,ID);
        std::vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>>::
        emplace_back<std::shared_ptr<pbrt::Shape>>
                  ((vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>>
                    *)&this->shapes,(shared_ptr<pbrt::Shape> *)&local_48);
        if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      uVar3 = binary->currentEntityOffset;
      puVar1 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = (long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1;
    }
    uVar5 = uVar3 + 4;
    if (uVar2 < uVar5) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      iVar4 = *(int *)(puVar1 + uVar3);
      binary->currentEntityOffset = uVar5;
      if (0 < iVar4) {
        do {
          uVar3 = binary->currentEntityOffset + 4;
          if ((ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(binary->currentEntityData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) < uVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
            goto LAB_00119560;
          }
          binary->currentEntityOffset = uVar3;
          BinaryReader::getEntity<pbrt::LightSource>((BinaryReader *)&local_48,ID);
          std::
          vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>
          ::emplace_back<std::shared_ptr<pbrt::LightSource>>
                    ((vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>
                      *)&this->lightSources,(shared_ptr<pbrt::LightSource> *)&local_48);
          if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        uVar5 = binary->currentEntityOffset;
        puVar1 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = (long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1;
      }
      if (uVar5 + 4 <= uVar2) {
        iVar4 = *(int *)(puVar1 + uVar5);
        binary->currentEntityOffset = uVar5 + 4;
        if (0 < iVar4) {
          do {
            uVar3 = binary->currentEntityOffset + 4;
            if ((ulong)((long)(binary->currentEntityData).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(binary->currentEntityData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) < uVar3) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"invalid read attempt by entity - not enough data in data block!");
              goto LAB_00119560;
            }
            binary->currentEntityOffset = uVar3;
            BinaryReader::getEntity<pbrt::Instance>((BinaryReader *)&local_48,ID);
            std::
            vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
            ::emplace_back<std::shared_ptr<pbrt::Instance>>
                      ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                        *)&this->instances,&local_48);
            if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
LAB_00119560:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Object::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();

    // read shapes
    int32_t numShapes = binary.read<int32_t>();
    assert(shapes.empty());
    for (int32_t i=0;i<numShapes;i++)
      shapes.push_back(binary.getEntity<Shape>(binary.read<int32_t>()));

    // read lightSources
    int numLightSources = binary.read<int32_t>();
    assert(lightSources.empty());
    for (int i=0;i<numLightSources;i++)
      lightSources.push_back(binary.getEntity<LightSource>(binary.read<int32_t>()));

    // read instances
    int32_t numInstances = binary.read<int32_t>();
    assert(instances.empty());
    for (int32_t i=0;i<numInstances;i++)
      instances.push_back(binary.getEntity<Instance>(binary.read<int32_t>()));
  }